

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::reset_all(http *this)

{
  string_map *this_00;
  string_pool *this_01;
  pointer peVar1;
  size_t __n;
  char *value;
  char *pcVar2;
  
  this->request_method_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_script_name_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_path_info_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_remote_addr_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_query_string_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_content_type_ = &(anonymous_namespace)::non_const_empty_string;
  this->env_content_length_ = 0;
  this->request_uri_ = &(anonymous_namespace)::non_const_empty_string;
  this->headers_done_ = false;
  this->first_header_observerd_ = false;
  this->total_read_ = 0;
  this->is_http_11_ = false;
  this->client_accepts_keep_alive_ = false;
  this->keep_alive_ = false;
  this->chunked_te_ = false;
  this->output_content_length_ = -1;
  this->output_written_ = 0;
  this->eof_callback_ = false;
  (this->input_parser_).state_ = idle;
  (this->input_parser_).bracket_counter_ = 0;
  (this->input_parser_).header_._M_string_length = 0;
  *(this->input_parser_).header_._M_dataplus._M_p = '\0';
  (this->input_parser_).epptr_ = (char **)0x0;
  (this->input_parser_).pbase_ = (char **)0x0;
  (this->input_parser_).pptr_ = (char **)0x0;
  peVar1 = (this->super_connection).env_.data_.
           super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_connection).env_.data_.
      super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish != peVar1) {
    (this->super_connection).env_.data_.
    super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = peVar1;
  }
  this_00 = &(this->super_connection).env_;
  std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
  resize(&(this->super_connection).env_.data_,0x40);
  (this->super_connection).env_.total_ = 0;
  (this->super_connection).env_.first_ = -1;
  this_01 = &(this->super_connection).pool_;
  string_pool::clear(this_01);
  string_map::add(this_00,"SERVER_SOFTWARE","CppCMS/2.0.0.beta2");
  pcVar2 = (this->ip_)._M_dataplus._M_p;
  __n = strlen(pcVar2);
  value = string_pool::allocate_space(this_01,__n + 1);
  memcpy(value,pcVar2,__n);
  value[__n] = '\0';
  string_map::add(this_00,"SERVER_NAME",value);
  pcVar2 = string_pool::allocate_space(this_01,10);
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  format_traits<int,_true>::format(this->port_,pcVar2,10);
  string_map::add(this_00,"SERVER_PORT",pcVar2);
  string_map::add(this_00,"GATEWAY_INTERFACE","CGI/1.0");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->super_connection).map_env_._M_t);
  return;
}

Assistant:

void reset_all()
		{
			request_method_ = non_const_empty_string;
			env_script_name_ = non_const_empty_string;
			env_path_info_ = non_const_empty_string;
			env_remote_addr_ = non_const_empty_string;
			env_query_string_ = non_const_empty_string;
			env_content_type_ = non_const_empty_string;
			env_content_length_ = 0;
			request_uri_ = non_const_empty_string;
			headers_done_ = false;
			first_header_observerd_ = false;
			total_read_ = 0;
			is_http_11_ = false;
			client_accepts_keep_alive_ = false;
			keep_alive_ = false;
			chunked_te_ = false;
			output_content_length_ = -1;
			output_written_ = 0;
			eof_callback_ = false;
			input_parser_.reset();

			env_.clear();
			pool_.clear();

			env_.add("SERVER_SOFTWARE",CPPCMS_PACKAGE_NAME "/" CPPCMS_PACKAGE_VERSION);
			env_.add("SERVER_NAME",pool_.add(ip_));
			char *sport = pool_.alloc(10);
			format_number(port_,sport,10);
			env_.add("SERVER_PORT",sport);
			env_.add("GATEWAY_INTERFACE","CGI/1.0");
            connection::reset_all();
		}